

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::PrecisionCase
          (PrecisionCase *this,Context *context,string *name,string *extension)

{
  TestContext *testCtx;
  int iVar1;
  char *name_00;
  char *description;
  CommandLine *this_00;
  string *extension_local;
  string *name_local;
  Context *context_local;
  PrecisionCase *this_local;
  
  testCtx = context->testContext;
  name_00 = (char *)std::__cxx11::string::c_str();
  description = (char *)std::__cxx11::string::c_str();
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name_00,description);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__PrecisionCase_011d1ce8;
  Context::Context(&this->m_ctx,context);
  tcu::ResultCollector::ResultCollector(&this->m_status);
  this_00 = tcu::TestContext::getCommandLine(context->testContext);
  iVar1 = tcu::CommandLine::getBaseSeed(this_00);
  de::Random::Random(&this->m_rnd,iVar1 + 0xdeadbeef);
  std::__cxx11::string::string((string *)&this->m_extension,(string *)extension);
  return;
}

Assistant:

PrecisionCase	(const Context&		context,
										 const string&		name,
										 const string&		extension	= "")
							: TestCase		(context.testContext,
											 name.c_str(),
											 name.c_str())
							, m_ctx			(context)
							, m_status		()
							, m_rnd			(0xdeadbeefu +
											 context.testContext.getCommandLine().getBaseSeed())
							, m_extension	(extension)
	{
	}